

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapinfo.cpp
# Opt level: O0

vector<PBombInfo,_std::allocator<PBombInfo>_> * __thiscall
MapInfo::getBombs(vector<PBombInfo,_std::allocator<PBombInfo>_> *__return_storage_ptr__,
                 MapInfo *this)

{
  bool bVar1;
  pointer pIVar2;
  undefined1 local_40 [8];
  PBombInfo p;
  _Self local_28;
  iterator it;
  MapInfo *this_local;
  vector<PBombInfo,_std::allocator<PBombInfo>_> *res;
  
  it._M_node._7_1_ = 0;
  std::vector<PBombInfo,_std::allocator<PBombInfo>_>::vector(__return_storage_ptr__);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<ItemInfo,_std::allocator<ItemInfo>_>::begin(&this->bombs);
  while( true ) {
    p.velocity = (Vec2)std::__cxx11::list<ItemInfo,_std::allocator<ItemInfo>_>::end(&this->bombs);
    bVar1 = std::operator!=(&local_28,(_Self *)&p.velocity);
    if (!bVar1) break;
    PBombInfo::PBombInfo((PBombInfo *)local_40);
    pIVar2 = std::_List_iterator<ItemInfo>::operator->(&local_28);
    local_40 = *(undefined1 (*) [8])&pIVar2->pos;
    pIVar2 = std::_List_iterator<ItemInfo>::operator->(&local_28);
    p.pos = pIVar2->velocity;
    std::vector<PBombInfo,_std::allocator<PBombInfo>_>::push_back
              (__return_storage_ptr__,(value_type *)local_40);
    std::_List_iterator<ItemInfo>::operator++(&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<PBombInfo> MapInfo::getBombs()
{
    vector<PBombInfo> res;
    for (auto it = bombs.begin(); it != bombs.end(); ++it)
    {
        PBombInfo p;
        p.pos = it->pos;
        p.velocity = it->velocity;
        res.push_back(p);
    }
    return res;
}